

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t read_body_to_string(archive_read *a,tar *tar,archive_string *as,void *h,size_t *unconsumed)

{
  size_t __n;
  archive_string *paVar1;
  void *__src;
  void *src;
  archive_entry_header_ustar *header;
  int64_t size;
  size_t *unconsumed_local;
  void *h_local;
  archive_string *as_local;
  tar *tar_local;
  archive_read *a_local;
  
  __n = tar_atol((char *)((long)h + 0x7c),0xc);
  if (((long)__n < 0x100001) && (-1 < (long)__n)) {
    paVar1 = archive_string_ensure(as,__n + 1);
    if (paVar1 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"No memory");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      tar_flush_unconsumed(a,unconsumed);
      *unconsumed = __n + 0x1ff & 0xfffffffffffffe00;
      __src = __archive_read_ahead(a,*unconsumed,(ssize_t *)0x0);
      if (__src == (void *)0x0) {
        *unconsumed = 0;
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        memcpy(as->s,__src,__n);
        as->s[__n] = '\0';
        as->length = __n;
        a_local._4_4_ = L'\0';
      }
    }
  }
  else {
    archive_set_error(&a->archive,0x16,"Special header too large");
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
read_body_to_string(struct archive_read *a, struct tar *tar,
    struct archive_string *as, const void *h, size_t *unconsumed)
{
	int64_t size;
	const struct archive_entry_header_ustar *header;
	const void *src;

	(void)tar; /* UNUSED */
	header = (const struct archive_entry_header_ustar *)h;
	size  = tar_atol(header->size, sizeof(header->size));
	if ((size > 1048576) || (size < 0)) {
		archive_set_error(&a->archive, EINVAL,
		    "Special header too large");
		return (ARCHIVE_FATAL);
	}

	/* Fail if we can't make our buffer big enough. */
	if (archive_string_ensure(as, (size_t)size+1) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory");
		return (ARCHIVE_FATAL);
	}

	tar_flush_unconsumed(a, unconsumed);

	/* Read the body into the string. */
	*unconsumed = (size_t)((size + 511) & ~ 511);
	src = __archive_read_ahead(a, *unconsumed, NULL);
	if (src == NULL) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}
	memcpy(as->s, src, (size_t)size);
	as->s[size] = '\0';
	as->length = (size_t)size;
	return (ARCHIVE_OK);
}